

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_multiplier.cpp
# Opt level: O2

void __thiscall icu_63::number::Scale::Scale(Scale *this,int32_t magnitude,DecNum *arbitraryToAdopt)

{
  decNumber *pdVar1;
  DecNum *this_00;
  bool bVar2;
  undefined4 in_register_00000034;
  
  this->fMagnitude = magnitude;
  this->fArbitrary = arbitraryToAdopt;
  this->fError = U_ZERO_ERROR;
  if (arbitraryToAdopt != (DecNum *)0x0) {
    impl::DecNum::normalize(arbitraryToAdopt);
    pdVar1 = (this->fArbitrary->fData).ptr;
    if (((pdVar1->digits == 1) && (pdVar1->lsu[0] == '\x01')) &&
       (bVar2 = impl::DecNum::isNegative(this->fArbitrary), !bVar2)) {
      this_00 = this->fArbitrary;
      this->fMagnitude = this->fMagnitude + ((this_00->fData).ptr)->exponent;
      MaybeStackHeaderAndArray<decNumber,_char,_34>::~MaybeStackHeaderAndArray(&this_00->fData);
      UMemory::operator_delete((UMemory *)this_00,(void *)CONCAT44(in_register_00000034,magnitude));
      this->fArbitrary = (DecNum *)0x0;
    }
  }
  return;
}

Assistant:

Scale::Scale(int32_t magnitude, DecNum* arbitraryToAdopt)
        : fMagnitude(magnitude), fArbitrary(arbitraryToAdopt), fError(U_ZERO_ERROR) {
    if (fArbitrary != nullptr) {
        // Attempt to convert the DecNum to a magnitude multiplier.
        fArbitrary->normalize();
        if (fArbitrary->getRawDecNumber()->digits == 1 && fArbitrary->getRawDecNumber()->lsu[0] == 1 &&
            !fArbitrary->isNegative()) {
            // Success!
            fMagnitude += fArbitrary->getRawDecNumber()->exponent;
            delete fArbitrary;
            fArbitrary = nullptr;
        }
    }
}